

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::retranslateStrings(QFileDialogPrivate *this)

{
  bool bVar1;
  ulong uVar2;
  qsizetype qVar3;
  int *piVar4;
  const_reference ppQVar5;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int total;
  QAbstractItemModel *abstractModel;
  QFileDialog *q;
  QDialog *in_stack_00000070;
  Ui_QFileDialog *in_stack_00000078;
  QList<QAction_*> actions;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffffe48;
  QAction *pQVar6;
  int iVar7;
  QFileDialogPrivate *in_stack_fffffffffffffe50;
  QFileDialogPrivate *this_00;
  QWidget *in_stack_fffffffffffffe58;
  QFileDialog *in_stack_fffffffffffffe60;
  QAction *pQVar8;
  int local_178;
  QFileSystemModel *local_170;
  int local_7c;
  undefined1 local_78 [28];
  int local_5c;
  QList<QAction_*> local_58 [2];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x74ff06);
  uVar2 = QFileDialogOptions::useDefaultNameFilters();
  if ((uVar2 & 1) != 0) {
    QFileDialogOptions::defaultNameFilterString();
    QFileDialog::setNameFilter(in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58);
    QString::~QString((QString *)0x74ff4a);
  }
  bVar1 = usingWidgets(in_stack_fffffffffffffe50);
  if (bVar1) {
    local_58[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58[0].d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    local_58[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QTreeView::header((QTreeView *)in_stack_fffffffffffffe50);
    QWidget::actions(in_stack_fffffffffffffe58);
    local_170 = in_RDI->model;
    if (in_RDI->proxyModel != (QAbstractProxyModel *)0x0) {
      local_170 = (QFileSystemModel *)in_RDI->proxyModel;
    }
    QModelIndex::QModelIndex((QModelIndex *)0x74fffa);
    local_5c = (**(code **)(*(long *)local_170 + 0x80))(local_170,local_78);
    qVar3 = QList<QAction_*>::size(local_58);
    local_7c = (int)qVar3 + 1;
    piVar4 = qMin<int>(&local_5c,&local_7c);
    iVar7 = *piVar4;
    for (local_178 = 1; local_178 < iVar7; local_178 = local_178 + 1) {
      ppQVar5 = QList<QAction_*>::at
                          ((QList<QAction_*> *)in_stack_fffffffffffffe50,
                           (qsizetype)in_stack_fffffffffffffe48);
      pQVar6 = *ppQVar5;
      QFileDialog::tr((char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                      (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      (**(code **)(*(long *)local_170 + 0xa0))(&local_28,local_170,local_178,1,0);
      ::QVariant::toString();
      ::operator+((QString *)in_stack_fffffffffffffe58,(QString *)in_stack_fffffffffffffe50);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe48);
      QAction::setText((QString *)pQVar6);
      QString::~QString((QString *)0x750124);
      QStringBuilder<QString,_QString>::~QStringBuilder
                ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffffe50);
      QString::~QString((QString *)0x75013e);
      ::QVariant::~QVariant(&local_28);
      QString::~QString((QString *)0x750158);
    }
    pQVar6 = in_RDI->renameAction;
    QFileDialog::tr((char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                    (int)((ulong)pQVar6 >> 0x20));
    QAction::setText((QString *)pQVar6);
    iVar7 = (int)((ulong)pQVar6 >> 0x20);
    QString::~QString((QString *)0x7501b3);
    this_00 = (QFileDialogPrivate *)in_RDI->deleteAction;
    QFileDialog::tr((char *)in_stack_fffffffffffffe58,(char *)this_00,iVar7);
    QAction::setText((QString *)this_00);
    QString::~QString((QString *)0x750200);
    pQVar6 = in_RDI->showHiddenAction;
    QFileDialog::tr((char *)pQVar6,(char *)this_00,iVar7);
    QAction::setText((QString *)pQVar6);
    QString::~QString((QString *)0x750244);
    pQVar8 = in_RDI->newFolderAction;
    QFileDialog::tr((char *)pQVar6,(char *)this_00,iVar7);
    QAction::setText((QString *)pQVar8);
    QString::~QString((QString *)0x750288);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    Ui_QFileDialog::retranslateUi(in_stack_00000078,in_stack_00000070);
    updateLookInLabel(this_00);
    updateFileNameLabel(this_00);
    updateFileTypeLabel(this_00);
    updateCancelButtonText(this_00);
    QList<QAction_*>::~QList((QList<QAction_*> *)0x7502db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::retranslateStrings()
{
    Q_Q(QFileDialog);
    /* WIDGETS */
    if (options->useDefaultNameFilters())
        q->setNameFilter(QFileDialogOptions::defaultNameFilterString());
    if (!usingWidgets())
        return;

    QList<QAction*> actions = qFileDialogUi->treeView->header()->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i) {
        actions.at(i - 1)->setText(QFileDialog::tr("Show ") + abstractModel->headerData(i, Qt::Horizontal, Qt::DisplayRole).toString());
    }

    /* MENU ACTIONS */
    renameAction->setText(QFileDialog::tr("&Rename"));
    deleteAction->setText(QFileDialog::tr("&Delete"));
    showHiddenAction->setText(QFileDialog::tr("Show &hidden files"));
    newFolderAction->setText(QFileDialog::tr("&New Folder"));
    qFileDialogUi->retranslateUi(q);
    updateLookInLabel();
    updateFileNameLabel();
    updateFileTypeLabel();
    updateCancelButtonText();
}